

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O0

void __thiscall CTcGenTarg::build_multimethod_initializers(CTcGenTarg *this)

{
  tc_symtype_t tVar1;
  tctarg_obj_id_t tVar2;
  CTcSymbol *this_00;
  CTcPrsSymtab *dict;
  void *pvVar3;
  size_t sVar4;
  void *__buf;
  void *__buf_00;
  long in_RDI;
  uchar in_stack_0000001f;
  CTcGenTarg *in_stack_00000020;
  tct3_tadsobj_ctx obj_ctx;
  CTcSymFunc *mmb;
  mminit_ctx ctx;
  tct3_method_gen_ctx genctx;
  textchar_t *in_stack_ffffffffffffff28;
  _func_void_void_ptr_CTcSymbol_ptr *func;
  tct3_method_gen_ctx *ctx_00;
  uint obj_id;
  CTcPrsSymtab *in_stack_ffffffffffffff30;
  CTcGenTarg *this_01;
  ulong uVar5;
  CTcDataStream *stream;
  undefined4 uVar6;
  uint in_stack_ffffffffffffff3c;
  undefined4 uVar7;
  uint in_stack_ffffffffffffff44;
  vm_obj_id_t obj_id_00;
  uint in_stack_ffffffffffffff4c;
  uint internal_flags;
  uint in_stack_ffffffffffffff54;
  uint vm_flags;
  CTcCodeStream *stream_00;
  CTcGenTarg *in_stack_ffffffffffffff60;
  tct3_method_gen_ctx *in_stack_ffffffffffffff68;
  tc_metaclass_t meta;
  long in_stack_ffffffffffffff70;
  CTcTokFileDesc *in_stack_ffffffffffffff78;
  CTcPrsSymtab *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  tct3_method_gen_ctx *in_stack_ffffffffffffffa0;
  mminit_ctx local_48;
  
  mminit_ctx::mminit_ctx(&local_48);
  CTcParser::get_global_symtab(G_prs);
  local_48.mmr = (CTcSymFunc *)
                 CTcPrsSymtab::find(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,0x22214c);
  sVar4 = 0;
  stream_00 = (CTcCodeStream *)&stack0xffffffffffffffc8;
  func = (_func_void_void_ptr_CTcSymbol_ptr *)
         ((ulong)in_stack_ffffffffffffff28 & 0xffffffff00000000);
  this_01 = (CTcGenTarg *)((ulong)in_stack_ffffffffffffff30 & 0xffffffff00000000);
  uVar6 = 0;
  uVar7 = 0;
  obj_id_00 = 0;
  internal_flags = 0;
  open_method(in_stack_ffffffffffffff60,stream_00,
              (CTcSymbol *)((ulong)in_stack_ffffffffffffff54 << 0x20),
              (CTcAbsFixup **)((ulong)in_stack_ffffffffffffff4c << 0x20),
              (CTPNCodeBody *)((ulong)in_stack_ffffffffffffff44 << 0x20),
              (CTcPrsSymtab *)((ulong)in_stack_ffffffffffffff3c << 0x20),
              (int)in_stack_ffffffffffffff70,(int)in_stack_ffffffffffffff78,
              (int)in_stack_ffffffffffffff80,(int)in_RDI,in_stack_ffffffffffffff90,
              in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
  CTcParser::get_global_symtab(G_prs);
  CTcPrsSymtab::enum_entries((CTcPrsSymtab *)this_01,func,(void *)0x2221df);
  if (local_48.cnt != 0) {
    CTcParser::get_global_symtab(G_prs);
    this_00 = CTcPrsSymtab::find((CTcPrsSymtab *)this_01,(textchar_t *)func,0x222210);
    if ((this_00 == (CTcSymbol *)0x0) ||
       (tVar1 = CTcSymbolBase::get_type(&this_00->super_CTcSymbolBase), tVar1 != TC_SYM_FUNC)) {
      CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2e32,
                         "_multiMethodBuildBindings");
      return;
    }
    write_op(in_stack_00000020,in_stack_0000001f);
    CTcDataStream::write(&G_cs->super_CTcDataStream,0,__buf,sVar4);
    CTcSymFuncBase::add_abs_fixup
              ((CTcSymFuncBase *)CONCAT44(in_stack_ffffffffffffff44,uVar7),
               (CTcDataStream *)CONCAT44(in_stack_ffffffffffffff3c,uVar6));
    CTcDataStream::write4
              ((CTcDataStream *)CONCAT44(in_stack_ffffffffffffff44,uVar7),
               CONCAT44(in_stack_ffffffffffffff3c,uVar6));
  }
  ctx_00 = (tct3_method_gen_ctx *)0x0;
  close_method((CTcGenTarg *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               (CTcNamedArgTab *)in_stack_ffffffffffffffa0);
  meta = (tc_metaclass_t)in_stack_ffffffffffffff70;
  close_method_cleanup(this_01,ctx_00);
  obj_id = (uint)((ulong)ctx_00 >> 0x20);
  if (local_48.cnt != 0) {
    if ((local_48.mmr == (CTcSymFunc *)0x0) ||
       (tVar1 = CTcSymbolBase::get_type((CTcSymbolBase *)local_48.mmr), tVar1 != TC_SYM_FUNC)) {
      CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2e32,"_multiMethodRegister"
                        );
      return;
    }
    tVar2 = new_obj_id(G_cg);
    *(tctarg_obj_id_t *)(in_RDI + 0xb8) = tVar2;
    dict = CTcParser::get_global_symtab(G_prs);
    pvVar3 = CTcSymbolBase::operator_new(0x22238a);
    uVar5 = 0;
    CTcSymObj::CTcSymObj
              ((CTcSymObj *)in_stack_ffffffffffffff60,(char *)stream_00,
               CONCAT44(in_stack_ffffffffffffff54,internal_flags),in_stack_ffffffffffffff4c,
               obj_id_00,in_stack_ffffffffffffff44,meta,(CTcDictEntry *)dict);
    vm_flags = (uint)stream_00;
    (*dict->_vptr_CTcPrsSymtab[3])(dict,pvVar3);
    sVar4 = (size_t)*(uint *)(in_RDI + 0xb8);
    stream = (CTcDataStream *)(uVar5 & 0xffffffff00000000);
    open_tadsobj((CTcGenTarg *)CONCAT44(in_stack_ffffffffffffff44,uVar7),
                 (tct3_tadsobj_ctx *)CONCAT44(in_stack_ffffffffffffff3c,uVar6),stream,obj_id,0,0,
                 internal_flags,vm_flags);
    CTcDataStream::write2(stream,obj_id);
    CTcDataStream::write(G_os,0xb,__buf_00,sVar4);
    CTcDataStream::get_ofs(G_os);
    CTcAbsFixup::add_abs_fixup
              ((CTcAbsFixup **)CONCAT44(in_stack_ffffffffffffff44,uVar7),
               (CTcDataStream *)CONCAT44(in_stack_ffffffffffffff3c,uVar6),(ulong)stream);
    CTcDataStream::write4
              ((CTcDataStream *)CONCAT44(in_stack_ffffffffffffff44,uVar7),
               CONCAT44(in_stack_ffffffffffffff3c,uVar6));
    close_tadsobj((CTcGenTarg *)CONCAT44(in_stack_ffffffffffffff44,uVar7),
                  (tct3_tadsobj_ctx *)CONCAT44(in_stack_ffffffffffffff3c,uVar6));
  }
  G_cs = G_cs_main;
  return;
}

Assistant:

void CTcGenTarg::build_multimethod_initializers()
{
    tct3_method_gen_ctx genctx;
    mminit_ctx ctx;

    /* look up the _multiMethodRegister function */
    ctx.mmr = (CTcSymFunc *)G_prs->get_global_symtab()->find(
        "_multiMethodRegister", 20);

    /* 
     *   open the method - it's a static initializer, so write it to the
     *   static stream 
     */
    G_cg->open_method(G_cs_static, 0, 0, 0, 0, 0, 0, FALSE,
                      FALSE, FALSE, FALSE, &genctx);

    /* scan the symbol table for multimethods and generate initializers */
    G_prs->get_global_symtab()->enum_entries(&multimethod_init_cb, &ctx);

    /* 
     *   if we found any multi-methods, generate a call to
     *   _multiMethodBuildBindings 
     */
    if (ctx.cnt != 0)
    {
        /* look up the function - it's an error if it's not defined */
        CTcSymFunc *mmb = (CTcSymFunc *)G_prs->get_global_symtab()->find(
            "_multiMethodBuildBindings", 25);
        if (mmb == 0 || mmb->get_type() != TC_SYM_FUNC)
        {
            G_tcmain->log_error(0, 0, TC_SEV_ERROR, TCERR_MISSING_MMREG,
                                "_multiMethodBuildBindings");
            return;
        }

        /* write the call instruction */
        G_cg->write_op(OPC_CALL);
        G_cs->write(0);                                   /* argument count */
        mmb->add_abs_fixup(G_cs);                 /* function address fixup */
        G_cs->write4(0);                               /* fixup placeholder */
    }

    /* close the method and clean up */
    G_cg->close_method(0, 0, 0, 0, &genctx, 0);
    G_cg->close_method_cleanup(&genctx);

    /* 
     *   if we generated any registrations, create the initializer object -
     *   this will go in the static initializer block to trigger invocation
     *   of the registration routine at load time 
     */
    if (ctx.cnt != 0)
    {
        /* we have multi-methods, so we definitely need _multiMethodRegister */
        if (ctx.mmr == 0 || ctx.mmr->get_type() != TC_SYM_FUNC)
        {
            G_tcmain->log_error(0, 0, TC_SEV_ERROR, TCERR_MISSING_MMREG,
                                "_multiMethodRegister");
            return;
        }

        /* create an anonymous object to hold the initializer code */
        mminit_obj_ = G_cg->new_obj_id();

        /* add a debugging symbol for it */
        G_prs->get_global_symtab()->add_entry(new CTcSymObj(
            "<multiMethodInit>", 17, FALSE, mminit_obj_, TRUE,
            TC_META_TADSOBJ, 0));

        /* write the object header: no superclasses, 1 property */
        tct3_tadsobj_ctx obj_ctx;
        open_tadsobj(&obj_ctx, G_os, mminit_obj_, 0, 1, 0, 0);
        
        /* write the static initializer property */
        G_os->write2(1);                           /* arbitrary property ID */
        G_os->write(VM_CODEOFS);    /* offset of the code we just generated */
        CTcAbsFixup::add_abs_fixup(
            &genctx.anchor->fixup_info_.internal_fixup_head_,
            G_os, G_os->get_ofs());
        G_os->write4(0);                                     /* placeholder */
        
        /* fix up the object size data */
        close_tadsobj(&obj_ctx);
    }

    /* switch back to the main stream */
    G_cs = G_cs_main;
}